

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlistmodel.cpp
# Opt level: O0

bool __thiscall
QStringListModel::removeRows(QStringListModel *this,int row,int count,QModelIndex *parent)

{
  long lVar1;
  int iVar2;
  int iVar3;
  iterator iVar4;
  iterator o;
  QModelIndex *in_RCX;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  iterator it;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  QList<QString> *in_stack_ffffffffffffff70;
  iterator *this_00;
  undefined8 in_stack_ffffffffffffff90;
  bool local_49;
  const_iterator local_48;
  const_iterator in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((0 < in_EDX) && (-1 < in_ESI)) {
    iVar2 = in_ESI + in_EDX;
    iVar3 = (**(code **)(*in_RDI + 0x78))(in_RDI,in_RCX);
    if (iVar2 <= iVar3) {
      QModelIndex::QModelIndex((QModelIndex *)0x8bb570);
      QAbstractItemModel::beginRemoveRows
                ((QAbstractItemModel *)CONCAT44(in_ESI,in_EDX),in_RCX,
                 (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),(int)in_stack_ffffffffffffff90);
      QList<QString>::begin(in_stack_ffffffffffffff70);
      iVar4 = QList<QString>::iterator::operator+
                        ((iterator *)in_stack_ffffffffffffff70,
                         CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      this_00 = (iterator *)(in_RDI + 2);
      QList<QString>::const_iterator::const_iterator
                ((const_iterator *)&stack0xffffffffffffffc8,iVar4);
      o = QList<QString>::iterator::operator+
                    (this_00,CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      QList<QString>::const_iterator::const_iterator(&local_48,o);
      iVar4 = QList<QString>::erase
                        ((QList<QString> *)o.i,in_stack_ffffffffffffffc8,(const_iterator)iVar4.i);
      QAbstractItemModel::endRemoveRows((QAbstractItemModel *)iVar4.i);
      local_49 = true;
      goto LAB_008bb636;
    }
  }
  local_49 = false;
LAB_008bb636:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_49;
  }
  __stack_chk_fail();
}

Assistant:

bool QStringListModel::removeRows(int row, int count, const QModelIndex &parent)
{
    if (count <= 0 || row < 0 || (row + count) > rowCount(parent))
        return false;

    beginRemoveRows(QModelIndex(), row, row + count - 1);

    const auto it = lst.begin() + row;
    lst.erase(it, it + count);

    endRemoveRows();

    return true;
}